

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

bool __thiscall bssl::cbb_add_hex_consttime(bssl *this,CBB *cbb,Span<const_unsigned_char> in)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  size_t sVar4;
  iterator puVar5;
  uint8_t b;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_char> *__range1;
  uint8_t *out;
  CBB *cbb_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = in.data_;
  out = (uint8_t *)this;
  cbb_local = cbb;
  sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&cbb_local);
  iVar3 = CBB_add_space((CBB *)this,(uint8_t **)&__range1,sVar4 << 1);
  if (iVar3 == 0) {
    in_local.size_._7_1_ = false;
  }
  else {
    __end1 = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)&cbb_local);
    puVar5 = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)&cbb_local);
    for (; __end1 != puVar5; __end1 = __end1 + 1) {
      bVar1 = *__end1;
      uVar2 = hex_char_consttime((uint8_t)((int)(uint)bVar1 >> 4));
      *(uint8_t *)&__range1->data_ = uVar2;
      __range1 = (Span<const_unsigned_char> *)((long)&__range1->data_ + 1);
      uVar2 = hex_char_consttime(bVar1 & 0xf);
      *(uint8_t *)&__range1->data_ = uVar2;
      __range1 = (Span<const_unsigned_char> *)((long)&__range1->data_ + 1);
    }
    in_local.size_._7_1_ = true;
  }
  return in_local.size_._7_1_;
}

Assistant:

static bool cbb_add_hex_consttime(CBB *cbb, Span<const uint8_t> in) {
  uint8_t *out;
  if (!CBB_add_space(cbb, &out, in.size() * 2)) {
    return false;
  }

  for (uint8_t b : in) {
    *(out++) = hex_char_consttime(b >> 4);
    *(out++) = hex_char_consttime(b & 0xf);
  }

  return true;
}